

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SaveNetworkData
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aFilename)

{
  string *aFilename_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SaveNetworkData(const std::string &aFilename)
{
    UNUSED(aFilename);
    return Error{};
}